

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O3

void cf2_builder_cubeTo(CF2_OutlineCallbacks callbacks,CF2_CallbackParams params)

{
  FT_Vector *pFVar1;
  FT_Vector FVar2;
  FT_Bool FVar3;
  short sVar4;
  PS_Builder *builder;
  FT_GlyphLoader loader;
  FT_Outline *pFVar5;
  char *pcVar6;
  int iVar7;
  FT_Outline *pFVar8;
  
  builder = (PS_Builder *)callbacks[1].moveTo;
  if (((builder->path_begun == '\0') &&
      (iVar7 = ps_builder_start_point(builder,(params->pt0).x,(params->pt0).y), iVar7 != 0)) ||
     ((loader = builder->loader,
      loader->max_points <
      (int)(loader->base).outline.n_points + (int)(loader->current).outline.n_points + 3U &&
      (iVar7 = FT_GlyphLoader_CheckPoints(loader,3,0), iVar7 != 0)))) {
    if (*callbacks->error != 0) {
      return;
    }
    *callbacks->error = iVar7;
    return;
  }
  pFVar5 = builder->current;
  if (builder->load_points == '\0') {
    pFVar5->n_points = pFVar5->n_points + 1;
    pFVar8 = pFVar5;
  }
  else {
    sVar4 = pFVar5->n_points;
    pcVar6 = pFVar5->tags;
    FVar2 = params->pt1;
    pFVar1 = pFVar5->points + sVar4;
    pFVar1->x = CONCAT44(FVar2.x._4_4_ >> 10,(int)((ulong)FVar2.x >> 10));
    *(int *)&pFVar1[1].x = (int)((ulong)FVar2.y >> 10);
    *(int *)((long)&pFVar1[1].x + 4) = FVar2.y._4_4_ >> 10;
    pcVar6[sVar4] = '\x02';
    pFVar8 = builder->current;
    FVar3 = builder->load_points;
    pFVar5->n_points = pFVar5->n_points + 1;
    if (FVar3 != '\0') {
      sVar4 = pFVar8->n_points;
      pcVar6 = pFVar8->tags;
      FVar2 = params->pt2;
      pFVar1 = pFVar8->points + sVar4;
      pFVar1->x = CONCAT44(FVar2.x._4_4_ >> 10,(int)((ulong)FVar2.x >> 10));
      *(int *)&pFVar1[1].x = (int)((ulong)FVar2.y >> 10);
      *(int *)((long)&pFVar1[1].x + 4) = FVar2.y._4_4_ >> 10;
      pcVar6[sVar4] = '\x02';
      pFVar5 = builder->current;
      FVar3 = builder->load_points;
      pFVar8->n_points = pFVar8->n_points + 1;
      pFVar8 = pFVar5;
      if (FVar3 != '\0') {
        sVar4 = pFVar5->n_points;
        pcVar6 = pFVar5->tags;
        FVar2 = params->pt3;
        pFVar1 = pFVar5->points + sVar4;
        pFVar1->x = CONCAT44(FVar2.x._4_4_ >> 10,(int)((ulong)FVar2.x >> 10));
        *(int *)&pFVar1[1].x = (int)((ulong)FVar2.y >> 10);
        *(int *)((long)&pFVar1[1].x + 4) = FVar2.y._4_4_ >> 10;
        pcVar6[sVar4] = '\x01';
      }
      goto LAB_002307a7;
    }
  }
  pFVar8->n_points = pFVar8->n_points + 1;
LAB_002307a7:
  pFVar8->n_points = pFVar8->n_points + 1;
  return;
}

Assistant:

static void
  cf2_builder_cubeTo( CF2_OutlineCallbacks      callbacks,
                      const CF2_CallbackParams  params )
  {
    FT_Error  error;

    /* downcast the object pointer */
    CF2_Outline  outline = (CF2_Outline)callbacks;
    PS_Builder*  builder;


    FT_ASSERT( outline && outline->decoder );
    FT_ASSERT( params->op == CF2_PathOpCubeTo );

    builder = &outline->decoder->builder;

    if ( !builder->path_begun )
    {
      /* record the move before the line; also check points and set */
      /* `path_begun'                                               */
      error = ps_builder_start_point( builder,
                                      params->pt0.x,
                                      params->pt0.y );
      if ( error )
      {
        if ( !*callbacks->error )
          *callbacks->error =  error;
        return;
      }
    }

    /* prepare room for 3 points: 2 off-curve, 1 on-curve */
    error = ps_builder_check_points( builder, 3 );
    if ( error )
    {
      if ( !*callbacks->error )
        *callbacks->error =  error;
      return;
    }

    ps_builder_add_point( builder,
                          params->pt1.x,
                          params->pt1.y, 0 );
    ps_builder_add_point( builder,
                          params->pt2.x,
                          params->pt2.y, 0 );
    ps_builder_add_point( builder,
                          params->pt3.x,
                          params->pt3.y, 1 );
  }